

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O0

void __thiscall
HawkTracer::client::CallgrindConverter::~CallgrindConverter(CallgrindConverter *this)

{
  CallgrindConverter *this_local;
  
  ~CallgrindConverter(this);
  operator_delete(this);
  return;
}

Assistant:

CallgrindConverter::~CallgrindConverter()
{
}